

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

uint stb_hash_number(uint hash)

{
  uint uVar1;
  
  uVar1 = hash * 8 ^ hash;
  uVar1 = (uVar1 >> 5) + uVar1;
  uVar1 = uVar1 * 0x10 ^ uVar1;
  uVar1 = (uVar1 >> 0x11) + uVar1;
  uVar1 = uVar1 * 0x2000000 ^ uVar1;
  return (uVar1 >> 6) + uVar1;
}

Assistant:

unsigned int stb_hash_number(unsigned int hash)
{
   hash ^= hash << 3;
   hash += hash >> 5;
   hash ^= hash << 4;
   hash += hash >> 17;
   hash ^= hash << 25;
   hash += hash >> 6;
   return hash;
}